

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::IsSet(cmMakefile *this,string *name)

{
  bool bVar1;
  cmValue cVar2;
  char *extraout_RDX;
  string_view value;
  
  cVar2 = GetDefinition(this,name);
  if ((cVar2.Value == (string *)0x0) ||
     ((cmValue *)(cVar2.Value)->_M_string_length == (cmValue *)0x0)) {
    bVar1 = false;
  }
  else {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar2.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsNOTFOUND((cmValue *)(cVar2.Value)->_M_string_length,value);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool cmMakefile::IsSet(const std::string& name) const
{
  cmValue value = this->GetDefinition(name);
  if (!value) {
    return false;
  }

  if (value->empty()) {
    return false;
  }

  if (cmIsNOTFOUND(*value)) {
    return false;
  }

  return true;
}